

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16,RegSlot R17,RegSlot R18)

{
  RegSlot local_54;
  RegSlot local_50;
  OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  layout.R2 = R4;
  layout.R3 = R5;
  layout.R4 = R6;
  layout.R5 = R7;
  layout.R6 = R8;
  layout.R7 = R9;
  layout.R8 = R10;
  layout.R9 = R11;
  layout.R10 = R12;
  layout.R11 = R13;
  layout.R12 = R14;
  layout.R13 = R15;
  layout.R14 = R16;
  layout.R15 = R17;
  layout.R16 = R18;
  local_54 = R0;
  local_50 = R1;
  layout.R0 = R2;
  layout.R1 = R3;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_54,0x4c,
             &this->super_ByteCodeWriter,false);
  return true;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg19(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
        RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16, RegSlot R17, RegSlot R18)
    {
        OpLayoutT_AsmReg19<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2) && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.R4, R4) &&
            SizePolicy::Assign(layout.R5, R5) && SizePolicy::Assign(layout.R6, R6) && SizePolicy::Assign(layout.R7, R7) && SizePolicy::Assign(layout.R8, R8) && SizePolicy::Assign(layout.R9, R9) &&
            SizePolicy::Assign(layout.R10, R10) && SizePolicy::Assign(layout.R11, R11) && SizePolicy::Assign(layout.R12, R12) && SizePolicy::Assign(layout.R13, R13) && SizePolicy::Assign(layout.R14, R14) &&
            SizePolicy::Assign(layout.R15, R15) && SizePolicy::Assign(layout.R16, R16) && SizePolicy::Assign(layout.R17, R17) && SizePolicy::Assign(layout.R18, R18))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }